

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

char * searchForTZFile(char *path,DefaultTZInfo *tzInfo)

{
  DefaultTZInfo *pDVar1;
  int iVar2;
  int32_t iVar3;
  DIR *__dirp;
  CharString *pCVar4;
  dirent *pdVar5;
  DIR *__dirp_00;
  FILE *pFVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  size_t __n;
  bool bVar11;
  bool bVar12;
  UErrorCode status;
  CharString newpath;
  CharString curpath;
  char *zoneid;
  UErrorCode local_2dc;
  DefaultTZInfo *local_2d8;
  char *local_2d0;
  FILE *local_2c8;
  long local_2c0;
  CharString local_2b8;
  CharString local_278;
  char *local_238 [65];
  
  local_2dc = U_ZERO_ERROR;
  local_2d8 = tzInfo;
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_278.buffer);
  local_278.len = 0;
  *local_278.buffer.ptr = '\0';
  pcVar9 = path;
  icu_63::CharString::append(&local_278,path,-1,&local_2dc);
  if ((local_2dc < U_ILLEGAL_ARGUMENT_ERROR) && (__dirp = opendir(path), __dirp != (DIR *)0x0)) {
    if (gSearchTZFileResult == (CharString *)0x0) {
      pCVar4 = (CharString *)icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar9);
      if (pCVar4 == (CharString *)0x0) {
        pCVar4 = (CharString *)0x0;
      }
      else {
        icu_63::MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)pCVar4);
        pCVar4->len = 0;
        *(pCVar4->buffer).ptr = '\0';
      }
      gSearchTZFileResult = pCVar4;
      if (pCVar4 == (CharString *)0x0) {
        pcVar9 = (char *)0x0;
        goto LAB_00320320;
      }
      ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
    }
    local_2d0 = (char *)0x0;
    do {
      pdVar5 = readdir(__dirp);
      pcVar9 = local_2d0;
      if (pdVar5 == (dirent *)0x0) break;
      pcVar9 = pdVar5->d_name;
      iVar2 = strcmp(pcVar9,".");
      bVar11 = true;
      if ((iVar2 != 0) && (iVar2 = strcmp(pcVar9,".."), iVar2 != 0)) {
        icu_63::CharString::CharString(&local_2b8,&local_278,&local_2dc);
        icu_63::CharString::append(&local_2b8,pcVar9,-1,&local_2dc);
        if (local_2dc < U_ILLEGAL_ARGUMENT_ERROR) {
          __dirp_00 = opendir(local_2b8.buffer.ptr);
          if (__dirp_00 == (DIR *)0x0) {
            iVar2 = strcmp("posixrules",pcVar9);
            bVar11 = true;
            if ((iVar2 != 0) &&
               (iVar2 = strcmp("localtime",pcVar9), pcVar9 = local_2b8.buffer.ptr, iVar2 != 0)) {
              if (local_2d8->defaultTZFilePtr == (FILE *)0x0) {
                pFVar6 = fopen("/etc/localtime","r");
                local_2d8->defaultTZFilePtr = (FILE *)pFVar6;
              }
              pFVar6 = fopen(pcVar9,"r");
              local_2d8->defaultTZPosition = 0;
              bVar12 = true;
              if ((pFVar6 != (FILE *)0x0) && ((FILE *)local_2d8->defaultTZFilePtr != (FILE *)0x0)) {
                if (local_2d8->defaultTZFileSize == 0) {
                  fseek((FILE *)local_2d8->defaultTZFilePtr,0,2);
                  pDVar1 = local_2d8;
                  lVar7 = ftell((FILE *)local_2d8->defaultTZFilePtr);
                  pDVar1->defaultTZFileSize = lVar7;
                }
                fseek(pFVar6,0,2);
                sVar8 = ftell(pFVar6);
                pDVar1 = local_2d8;
                bVar12 = true;
                if (sVar8 == local_2d8->defaultTZFileSize) {
                  if (local_2d8->defaultTZBuffer == (char *)0x0) {
                    rewind((FILE *)local_2d8->defaultTZFilePtr);
                    pcVar9 = (char *)uprv_malloc_63(pDVar1->defaultTZFileSize);
                    local_2d8->defaultTZBuffer = pcVar9;
                    fread(pcVar9,1,local_2d8->defaultTZFileSize,(FILE *)local_2d8->defaultTZFilePtr)
                    ;
                  }
                  rewind(pFVar6);
                  if ((long)sVar8 < 1) {
                    bVar12 = false;
                  }
                  else {
                    do {
                      local_2c8 = pFVar6;
                      pFVar6 = local_2c8;
                      memset(local_238,0,0x200);
                      sVar10 = 0x200;
                      if ((long)sVar8 < 0x200) {
                        sVar10 = sVar8;
                      }
                      sVar10 = fread(local_238,1,sVar10,pFVar6);
                      pDVar1 = local_2d8;
                      local_2c0 = (long)local_2d8->defaultTZPosition;
                      __n = (size_t)(int)sVar10;
                      iVar2 = bcmp(local_2d8->defaultTZBuffer + local_2c0,local_238,__n);
                      bVar12 = iVar2 != 0;
                      pFVar6 = local_2c8;
                      if (bVar12) break;
                      pDVar1->defaultTZPosition = (int)sVar10 + (int)local_2c0;
                      sVar10 = sVar8 - __n;
                      bVar11 = (long)__n <= (long)sVar8;
                      sVar8 = sVar10;
                    } while (sVar10 != 0 && bVar11);
                  }
                }
              }
              if (pFVar6 != (FILE *)0x0) {
                fclose(pFVar6);
              }
              bVar11 = true;
              if (!bVar12) {
                iVar3 = local_2b8.len;
                if (0x13 < local_2b8.len) {
                  iVar3 = 0x14;
                }
                local_238[0] = local_2b8.buffer.ptr + iVar3;
                skipZoneIDPrefix(local_238);
                pCVar4 = gSearchTZFileResult;
                gSearchTZFileResult->len = 0;
                *(pCVar4->buffer).ptr = '\0';
                icu_63::CharString::append(pCVar4,local_238[0],-1,&local_2dc);
                if (local_2dc < U_ILLEGAL_ARGUMENT_ERROR) {
                  local_2d0 = (gSearchTZFileResult->buffer).ptr;
                }
                goto LAB_00320056;
              }
            }
          }
          else {
            closedir(__dirp_00);
            icu_63::CharString::append(&local_2b8,'/',&local_2dc);
            if (U_ZERO_ERROR < local_2dc) goto LAB_00320056;
            local_2d0 = searchForTZFile(local_2b8.buffer.ptr,local_2d8);
            bVar11 = local_2d0 == (char *)0x0;
          }
        }
        else {
LAB_00320056:
          bVar11 = false;
        }
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_2b8.buffer);
      }
      pcVar9 = local_2d0;
    } while (bVar11);
  }
  else {
    __dirp = (DIR *)0x0;
    pcVar9 = (char *)0x0;
  }
LAB_00320320:
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_278.buffer);
  return pcVar9;
}

Assistant:

static char* searchForTZFile(const char* path, DefaultTZInfo* tzInfo) {
    DIR* dirp = NULL;
    struct dirent* dirEntry = NULL;
    char* result = NULL;
    UErrorCode status = U_ZERO_ERROR;

    /* Save the current path */
    CharString curpath(path, -1, status);
    if (U_FAILURE(status)) {
        goto cleanupAndReturn;
    }

    dirp = opendir(path);
    if (dirp == NULL) {
        goto cleanupAndReturn;
    }

    if (gSearchTZFileResult == NULL) {
        gSearchTZFileResult = new CharString;
        if (gSearchTZFileResult == NULL) {
            goto cleanupAndReturn;
        }
        ucln_common_registerCleanup(UCLN_COMMON_PUTIL, putil_cleanup);
    }

    /* Check each entry in the directory. */
    while((dirEntry = readdir(dirp)) != NULL) {
        const char* dirName = dirEntry->d_name;
        if (uprv_strcmp(dirName, SKIP1) != 0 && uprv_strcmp(dirName, SKIP2) != 0) {
            /* Create a newpath with the new entry to test each entry in the directory. */
            CharString newpath(curpath, status);
            newpath.append(dirName, -1, status);
            if (U_FAILURE(status)) {
                break;
            }

            DIR* subDirp = NULL;
            if ((subDirp = opendir(newpath.data())) != NULL) {
                /* If this new path is a directory, make a recursive call with the newpath. */
                closedir(subDirp);
                newpath.append('/', status);
                if (U_FAILURE(status)) {
                    break;
                }
                result = searchForTZFile(newpath.data(), tzInfo);
                /*
                 Have to get out here. Otherwise, we'd keep looking
                 and return the first match in the top-level directory
                 if there's a match in the top-level. If not, this function
                 would return NULL and set gTimeZoneBufferPtr to NULL in initDefault().
                 It worked without this in most cases because we have a fallback of calling
                 localtime_r to figure out the default timezone.
                */
                if (result != NULL)
                    break;
            } else if (uprv_strcmp(TZFILE_SKIP, dirName) != 0 && uprv_strcmp(TZFILE_SKIP2, dirName) != 0) {
                if(compareBinaryFiles(TZDEFAULT, newpath.data(), tzInfo)) {
                    int32_t amountToSkip = sizeof(TZZONEINFO) - 1;
                    if (amountToSkip > newpath.length()) {
                        amountToSkip = newpath.length();
                    }
                    const char* zoneid = newpath.data() + amountToSkip;
                    skipZoneIDPrefix(&zoneid);
                    gSearchTZFileResult->clear();
                    gSearchTZFileResult->append(zoneid, -1, status);
                    if (U_FAILURE(status)) {
                        break;
                    }
                    result = gSearchTZFileResult->data();
                    /* Get out after the first one found. */
                    break;
                }
            }
        }
    }

  cleanupAndReturn:
    if (dirp) {
        closedir(dirp);
    }
    return result;
}